

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O0

int RDL_pathsShareOnlyStart(uint r,uint y,uint z,RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  uint *vertInRZ;
  uint *vertInRY;
  uint count;
  uint pnt;
  uint i;
  uint result;
  RDL_sPathInfo *spi_local;
  RDL_graph *gra_local;
  uint z_local;
  uint y_local;
  uint r_local;
  
  pnt = 0;
  vertInRY._0_4_ = 0;
  __ptr = malloc((ulong)gra->V << 2);
  __ptr_00 = malloc((ulong)gra->V << 2);
  for (count = 0; count < gra->V; count = count + 1) {
    *(undefined4 *)((long)__ptr + (ulong)count * 4) = 0;
    *(undefined4 *)((long)__ptr_00 + (ulong)count * 4) = 0;
  }
  *(undefined4 *)((long)__ptr + (ulong)y * 4) = 1;
  *(undefined4 *)((long)__ptr_00 + (ulong)z * 4) = 1;
  uVar1 = y;
  do {
    vertInRY._4_4_ = uVar1;
    uVar1 = spi->pred[r][vertInRY._4_4_];
    *(undefined4 *)((long)__ptr + (ulong)uVar1 * 4) = 1;
    vertInRY._4_4_ = z;
  } while (uVar1 != r);
  do {
    vertInRY._4_4_ = spi->pred[r][vertInRY._4_4_];
    *(undefined4 *)((long)__ptr_00 + (ulong)vertInRY._4_4_ * 4) = 1;
  } while (vertInRY._4_4_ != r);
  for (count = 0; count < gra->V && (uint)vertInRY < 2; count = count + 1) {
    if ((*(int *)((long)__ptr + (ulong)count * 4) == 1) &&
       (*(int *)((long)__ptr_00 + (ulong)count * 4) == 1)) {
      vertInRY._0_4_ = (uint)vertInRY + 1;
    }
  }
  if ((((uint)vertInRY == 1) && (*(int *)((long)__ptr + (ulong)r * 4) == 1)) &&
     (*(int *)((long)__ptr_00 + (ulong)r * 4) == 1)) {
    pnt = 1;
  }
  free(__ptr);
  free(__ptr_00);
  return pnt;
}

Assistant:

static int RDL_pathsShareOnlyStart(unsigned r, unsigned y, unsigned z, RDL_graph *gra, RDL_sPathInfo *spi)
{
  unsigned result = 0, i, pnt, count=0;
  unsigned *vertInRY, *vertInRZ; /*edges in P(r,y) and P(r,z)*/
  vertInRY = malloc(gra->V * sizeof(*vertInRY));
  vertInRZ = malloc(gra->V * sizeof(*vertInRZ));

  for(i=0; i<gra->V; ++i)
  {
    vertInRY[i] = 0;
    vertInRZ[i] = 0;
  }
  vertInRY[y] = 1;
  vertInRZ[z] = 1;
  /*find out which vertices are on the path P(r,y)*/
  pnt = y;
  do
  {
    pnt = spi->pred[r][pnt];
    vertInRY[pnt] = 1;
  }while(pnt != r);
  /*find out which vertices are on the path P(r,z)*/
  pnt = z;
  do
  {
    pnt = spi->pred[r][pnt];
    vertInRZ[pnt] = 1;
  }while(pnt != r);
  /*find out if more than one vertex is shared by the paths*/
  for(i=0; i<gra->V && count<2; ++i)
  {
    if(vertInRY[i] == 1 && vertInRZ[i] == 1)
    {
      ++count;
    }
  }
  /*if r is the only shared vertex of the two paths return 1*/
  if(count == 1 && (vertInRY[r] == 1) && (vertInRZ[r] == 1))
  {
    result = 1;
  }

  free(vertInRY);
  free(vertInRZ);
  return result;
}